

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O1

void QtPrivate::QDebugStreamOperatorForType<QByteArray,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  char *begin;
  
  begin = *(char **)((long)a + 8);
  if (begin == (char *)0x0) {
    begin = "";
  }
  QDebug::putByteArray(dbg,begin,*(size_t *)((long)a + 0x10),ContainsBinary);
  if (dbg->stream->space == true) {
    ::QTextStream::operator<<(&dbg->stream->ts,' ');
    return;
  }
  return;
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }